

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O1

void copy_brands(_Bool **dest,_Bool *source)

{
  brand_conflict *pbVar1;
  int iVar2;
  _Bool *p_Var3;
  _Bool *p_Var4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  _Bool *p_Var8;
  long lVar9;
  
  if (source != (_Bool *)0x0) {
    if (*dest == (_Bool *)0x0) {
      p_Var3 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
      *dest = p_Var3;
    }
    uVar6 = (ulong)z_info->brand_max;
    if (uVar6 != 0) {
      p_Var3 = *dest;
      uVar5 = 0;
      do {
        p_Var3[uVar5] = (_Bool)(p_Var3[uVar5] | source[uVar5]);
        uVar5 = uVar5 + 1;
      } while (uVar6 != uVar5);
      lVar9 = 0;
      uVar5 = 0;
      do {
        pbVar1 = brands;
        if (uVar5 != 0) {
          p_Var8 = *dest;
          p_Var3 = p_Var8 + uVar5;
          lVar7 = 0;
          do {
            if ((*p_Var3 == true) && (*p_Var8 == true)) {
              iVar2 = strcmp(pbVar1[uVar5].name,*(char **)((long)&pbVar1->name + lVar7));
              if (iVar2 == 0) {
                p_Var4 = p_Var8;
                if (pbVar1[uVar5].multiplier < *(int *)((long)&pbVar1->multiplier + lVar7)) {
                  p_Var4 = p_Var3;
                }
                *p_Var4 = false;
              }
            }
            lVar7 = lVar7 + 0x30;
            p_Var8 = p_Var8 + 1;
          } while (lVar9 != lVar7);
        }
        uVar5 = uVar5 + 1;
        lVar9 = lVar9 + 0x30;
      } while (uVar5 != uVar6);
    }
  }
  return;
}

Assistant:

void copy_brands(bool **dest, bool *source)
{
	int i, j;

	/* Check structures */
	if (!source) return;
	if (!(*dest))
		*dest = mem_zalloc(z_info->brand_max * sizeof(bool));

	/* Copy */
	for (i = 0; i < z_info->brand_max; i++)
		(*dest)[i] |= source[i];

	/* Check for duplicates */
	for (i = 0; i < z_info->brand_max; i++) {
		for (j = 0; j < i; j++) {
			if ((*dest)[i] && (*dest)[j] &&
				streq(brands[i].name, brands[j].name)) {
				if (brands[i].multiplier < brands[j].multiplier) {
					(*dest)[i] = false;
				} else {
					(*dest)[j] = false;
				}
			}
		}
	}
}